

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_firstIndexOf_fromIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  ulong uVar1;
  shared_ptr<Instance> *psVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  undefined8 *puVar6;
  InstanceIsEqualToComparator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  it;
  int from_index;
  shared_ptr<Instance> instance;
  IntegerInstance *in_stack_fffffffffffffe88;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int iVar8;
  allocator local_139 [5];
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  IntegerInstance *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  local_a8 [3];
  IntegerInstance local_90;
  int local_2c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar5 != 2) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  this_00 = (InstanceIsEqualToComparator *)(in_RSI + 0x58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  get_shared_instance(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,1);
  IntegerInstance::IntegerInstance(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar4 = IntegerInstance::value(&local_90);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bf469);
  local_2c = iVar4;
  if (-1 < iVar4) {
    iVar8 = iVar4;
    sVar5 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78));
    if (iVar4 <= (int)sVar5) {
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 in_stack_fffffffffffffe88);
      local_a8[0] = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                    ::operator+((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                                 *)CONCAT44(iVar8,iVar4),
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      do {
        std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
                  ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *
                   )in_stack_fffffffffffffe88);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                            *)in_stack_fffffffffffffe88);
        if (!bVar3) {
          paVar7 = local_139;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(in_RDI,"-1",paVar7);
          std::allocator<char>::~allocator((allocator<char> *)local_139);
LAB_001bf675:
          std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1bf682);
          return in_RDI;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
        ::operator*(local_a8);
        bVar3 = InstanceIsEqualToComparator::operator()
                          (this_00,(shared_ptr<Instance> *)CONCAT44(iVar8,iVar4),
                           (shared_ptr<Instance> *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        in_stack_fffffffffffffe94 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe94);
        if (bVar3) {
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                    ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                      *)in_stack_fffffffffffffe88);
          __gnu_cxx::operator-
                    ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                      *)in_stack_fffffffffffffe88);
          psVar2 = stack0xfffffffffffffec8;
          uVar1 = (ulong)stack0xfffffffffffffec8 >> 0x20;
          iVar4 = (int)uVar1;
          unique0x100003a0 = psVar2;
          IntegerInstance::IntegerInstance
                    ((IntegerInstance *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),iVar4);
          IntegerInstance::representation_abi_cxx11_(in_stack_fffffffffffffe88);
          IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bf5d1);
          goto LAB_001bf675;
        }
        register0x00000000 =
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
             ::operator++((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                           *)CONCAT44(iVar8,iVar4),in_stack_fffffffffffffe94);
      } while( true );
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_firstIndexOf_fromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (auto it = _value.begin() + from_index; it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            return IntegerInstance(it - _value.begin()).representation();
    return "-1";
}